

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetReturnCallDropKeepCount
          (BinaryReaderInterp *this,FuncType *func_type,Index keep_extra,Index *out_drop_count,
          Index *out_keep_count)

{
  bool bVar1;
  Index keep_count_00;
  Result result;
  Index IVar2;
  size_type sVar3;
  Index keep_count;
  Index *out_keep_count_local;
  Index *out_drop_count_local;
  Index keep_extra_local;
  FuncType *func_type_local;
  BinaryReaderInterp *this_local;
  
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&func_type->params);
  keep_count_00 = (int)sVar3 + keep_extra;
  result = GetDropCount(this,keep_count_00,0,out_drop_count);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    IVar2 = SharedValidator::GetLocalCount(&this->validator_);
    *out_drop_count = IVar2 + *out_drop_count;
    *out_keep_count = keep_count_00;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::GetReturnCallDropKeepCount(const FuncType& func_type,
                                                      Index keep_extra,
                                                      Index* out_drop_count,
                                                      Index* out_keep_count) {
  Index keep_count = static_cast<Index>(func_type.params.size()) + keep_extra;
  CHECK_RESULT(GetDropCount(keep_count, 0, out_drop_count));
  *out_drop_count += validator_.GetLocalCount();
  *out_keep_count = keep_count;
  return Result::Ok;
}